

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EcMasterlibMain.cpp
# Opt level: O0

EC_T_DWORD EnableRealtimeEnvironment(void)

{
  int iVar1;
  bool local_1c1;
  sched_param local_1c0;
  uint local_1bc;
  sched_param schedParam;
  EC_T_BOOL bHighResTimerAvail;
  EC_T_DWORD dwResult;
  int nRetval;
  timespec ts;
  uint local_198;
  int nSub;
  int nMin;
  int nMaj;
  utsname SystemName;
  
  schedParam.sched_priority = -0x67ef0000;
  iVar1 = uname((utsname *)((long)&nMin + 2));
  if (iVar1 == 0) {
    __isoc99_sscanf(SystemName.nodename + 0x39,"%d.%d.%d",&nSub,&local_198,
                    (undefined1 *)((long)&ts.tv_nsec + 4));
    if (((nSub == 2) && (local_198 == 6)) || (2 < nSub)) {
      local_1c0.__sched_priority = 0x27;
      iVar1 = sched_setscheduler(0,1,&local_1c0);
      if (iVar1 == -1) {
        printf(
              "ERROR - cannot change scheduling policy!\nroot privilege is required or realtime group has to be joined!\n"
              );
      }
      else {
        iVar1 = mlockall(3);
        if (iVar1 == -1) {
          printf("ERROR - cannot disable paging!\n");
          schedParam.sched_priority = -0x67ef0000;
        }
        else {
          iVar1 = clock_getres(1,(timespec *)&dwResult);
          if (iVar1 == 0) {
            local_1c1 = _dwResult != 0 || ts.tv_sec != 1;
            local_1bc = (uint)((local_1c1 ^ 0xffU) & 1);
          }
          else {
            local_1bc = 0;
          }
          if (local_1bc == 0) {
            printf("WARNING: High resolution timers not available\n");
          }
          OsSleepSetType(2);
          schedParam.sched_priority = 0;
        }
      }
    }
    else {
      printf("ERROR - detected kernel = %d.%d.%d, required Linux kernel >= 2.6\n",(ulong)(uint)nSub,
             (ulong)local_198,(ulong)ts.tv_nsec._4_4_);
      schedParam.sched_priority = -0x67ef0000;
    }
  }
  else {
    printf("ERROR calling uname(), required Linux kernel >= 2.6\n");
    schedParam.sched_priority = -0x67ef0000;
  }
  return schedParam.sched_priority;
}

Assistant:

EC_T_DWORD EnableRealtimeEnvironment( EC_T_VOID )
{
   struct utsname SystemName;
   int nMaj, nMin, nSub;
   struct timespec ts;
   int nRetval;
   EC_T_DWORD dwResult = EC_E_ERROR;
   EC_T_BOOL bHighResTimerAvail;
   struct sched_param schedParam;

   /* master only tested on >= 2.6 kernel */
   nRetval = uname( &SystemName );
   if (nRetval != 0)
   {
      OsPrintf( "ERROR calling uname(), required Linux kernel >= 2.6\n" );
      dwResult = EC_E_ERROR;
      goto Exit;
   }
   sscanf( SystemName.release, "%d.%d.%d", &nMaj, &nMin, &nSub );
   if (!(((nMaj == 2) && (nMin == 6)) || (nMaj >= 3)))
   {
      OsPrintf( "ERROR - detected kernel = %d.%d.%d, required Linux kernel >= 2.6\n", nMaj, nMin, nSub );
      dwResult = EC_E_ERROR;
      goto Exit;
   }

   /* request realtime scheduling for the current process
    * This value is overwritten for each individual task
    */
   schedParam.sched_priority = MAIN_THREAD_PRIO; /* 1 lowest priority, 99 highest priority */
   nRetval = sched_setscheduler( 0, SCHED_FIFO, &schedParam );
   if (nRetval == -1)
   {
      OsPrintf( "ERROR - cannot change scheduling policy!\n"
                "root privilege is required or realtime group has to be joined!\n" );
      goto Exit;
   }

   /* disable paging */
   nRetval = mlockall( MCL_CURRENT | MCL_FUTURE );
   if (nRetval == -1)
   {
      OsPrintf( "ERROR - cannot disable paging!\n" );
      dwResult = EC_E_ERROR;
      goto Exit;
   }

   /* check if high resolution timers are available */
   if (clock_getres(CLOCK_MONOTONIC, &ts))
   {
      bHighResTimerAvail = EC_FALSE;
   }
   else
   {
      bHighResTimerAvail = !(ts.tv_sec != 0 || ts.tv_nsec != 1);
   }
   if( !bHighResTimerAvail )
   {
      OsPrintf( "WARNING: High resolution timers not available\n" );
   }

   /* set type of OsSleep implementation  (eSLEEP_USLEEP, eSLEEP_NANOSLEEP or eSLEEP_CLOCK_NANOSLEEP) */
   OsSleepSetType( eSLEEP_CLOCK_NANOSLEEP );

   dwResult = EC_E_NOERROR;
Exit:
    return dwResult;
}